

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnf.hpp
# Opt level: O2

void __thiscall bal::Cnf::append_clause(Cnf *this,literalid_t *literals,clause_size_t literals_size)

{
  uint *puVar1;
  uint uVar2;
  clause_size_t cVar3;
  undefined6 in_register_00000012;
  uint32_t *literals_00;
  insertion_point_t l0_insertion_point;
  insertion_point_t iStack_38;
  
  uVar2 = (uint)CONCAT62(in_register_00000012,literals_size);
  Container<unsigned_int>::reserve(&this->clauses_,uVar2 + 1);
  puVar1 = (this->clauses_).data_;
  puVar1[(this->clauses_).size_] = uVar2;
  literals_00 = puVar1 + (ulong)(this->clauses_).size_ + 1;
  if (uVar2 != 0) {
    memmove(literals_00,literals,(ulong)((uint)literals_size * 4));
  }
  cVar3 = normalize_clause(literals_00,literals_size);
  (this->clauses_).data_[(this->clauses_).size_] = (uint)cVar3;
  iStack_38.super_container_index_insertion_point_t.version_stamp = 0xffffffff;
  __append_clause<false>(this,&iStack_38);
  return;
}

Assistant:

inline void append_clause(const literalid_t* const literals, const clause_size_t literals_size) {
            clauses_.reserve(literals_size + 1);
            clauses_.data_[clauses_.size_] = literals_size; // no flags
            literalid_t* const dst_literals = clauses_.data_ + clauses_.size_ + 1;
            std::copy(literals, literals + literals_size, dst_literals);
            clauses_.data_[clauses_.size_] = normalize_clause(dst_literals, literals_size);
            l0_index_t::insertion_point_t l0_insertion_point;
            __insertion_point_t_init(l0_insertion_point);
            __append_clause<false>(l0_insertion_point);
        }